

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<std::array<double,3ul>>
          (AsciiParser *this,char sep,char end_symbol,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *result)

{
  pointer *ppaVar1;
  pointer paVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  char cVar7;
  array<double,_3UL> value_1;
  array<double,_3UL> value;
  string local_68;
  array<double,_3UL> local_48;
  
  paVar2 = (result->
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != paVar2) {
    (result->super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)
    ._M_impl.super__Vector_impl_data._M_finish = paVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ParseBasicTypeTuple<double,3ul>(this,&local_48);
    if (bVar5) {
      iVar3._M_current =
           (result->
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>::
        _M_realloc_insert<std::array<double,3ul>const&>
                  ((vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>> *)result,
                   iVar3,&local_48);
      }
      else {
        (iVar3._M_current)->_M_elems[2] = local_48._M_elems[2];
        (iVar3._M_current)->_M_elems[0] =
             (double)CONCAT71(local_48._M_elems[0]._1_7_,local_48._M_elems[0]._0_1_);
        (iVar3._M_current)->_M_elems[1] = local_48._M_elems[1];
        ppaVar1 = &(result->
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Not starting with the value of requested type.\n","");
      PushError(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_0039323f;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,(char *)&local_48);
        cVar7 = '\x01';
        if (bVar5) {
          if (local_48._M_elems[0]._0_1_ == sep) {
            bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar5) {
              bVar5 = LookChar1(this,(char *)&local_68);
              cVar7 = ((char)local_68._M_dataplus._M_p == end_symbol) * '\x03';
              if (!bVar5) {
                cVar7 = '\x01';
              }
              if ((char)local_68._M_dataplus._M_p != end_symbol && bVar5) goto LAB_003931ad;
            }
          }
          else {
LAB_003931ad:
            if (local_48._M_elems[0]._0_1_ == sep) {
              cVar7 = '\x01';
              bVar5 = SkipWhitespaceAndNewline(this,true);
              if (bVar5) {
                bVar5 = ParseBasicTypeTuple<double,3ul>(this,(array<double,_3UL> *)&local_68);
                cVar7 = '\x03';
                if (bVar5) {
                  iVar3._M_current =
                       (result->
                       super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>::
                    _M_realloc_insert<std::array<double,3ul>const&>
                              ((vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>
                                *)result,iVar3,(array<double,_3UL> *)&local_68);
                  }
                  else {
                    (iVar3._M_current)->_M_elems[2] = (double)local_68.field_2._M_allocated_capacity
                    ;
                    (iVar3._M_current)->_M_elems[0] = (double)local_68._M_dataplus._M_p;
                    (iVar3._M_current)->_M_elems[1] = (double)local_68._M_string_length;
                    ppaVar1 = &(result->
                               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  cVar7 = '\0';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar7 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_))
              {
                pSVar4->idx_ = uVar6;
              }
            }
          }
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x01') {
LAB_0039323f:
        if ((result->
            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Empty array.\n","");
        PushError(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}